

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  MemoryManager *m;
  undefined1 *puVar1;
  byte bVar2;
  uint uVar3;
  H10 *pHVar4;
  H9 *pHVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  H2 *pHVar8;
  H4 *pHVar9;
  H42 *pHVar10;
  H6 *pHVar11;
  H3 *pHVar12;
  H5 *pHVar13;
  H7 *pHVar14;
  undefined8 uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong ringbuffer_mask;
  uint32_t *puVar19;
  uint8_t *puVar20;
  int *table;
  ulong uVar21;
  Command *pCVar22;
  ulong uVar23;
  H54 *pHVar24;
  H8 *pHVar25;
  uint16_t *puVar26;
  H40 *pHVar27;
  char cVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  BrotliEncoderParams *pBVar32;
  int iVar33;
  BrotliEncoderParams *pBVar34;
  BrotliEncoderParams *pBVar35;
  size_t *psVar36;
  ulong uVar37;
  ushort uVar38;
  ushort uVar39;
  undefined4 in_register_00000034;
  uint8_t *puVar40;
  size_t sVar41;
  ulong uVar42;
  H9 *pHVar43;
  ushort uVar44;
  uint uVar45;
  uint32_t uVar46;
  long lVar47;
  uint8_t prev_byte2;
  ulong uVar48;
  ulong uVar49;
  ContextType literal_context_mode;
  H9 *pHVar50;
  uint8_t **ppuVar51;
  ulong uVar52;
  size_t sVar53;
  long lVar54;
  bool bVar55;
  ulong local_1a8;
  ulong local_1a0;
  size_t storage_ix_1;
  size_t *local_190;
  BrotliEncoderParams *local_188;
  BrotliEncoderParams *local_180;
  int *local_178;
  int local_16c;
  Hashers *local_168;
  ulong local_160;
  size_t table_size;
  ContextType local_14c;
  BrotliEncoderParams *local_148;
  BrotliEncoderParams *local_140;
  size_t *local_138;
  uint8_t **local_130;
  ulong local_128;
  size_t local_120;
  uint32_t *local_118;
  size_t storage_ix;
  BlockSplit local_e0;
  BlockSplit local_b0;
  uint32_t *local_80;
  size_t sStack_78;
  uint32_t *local_70;
  size_t sStack_68;
  HistogramLiteral *local_60;
  size_t sStack_58;
  HistogramCommand *local_50;
  size_t sStack_48;
  HistogramDistance *local_40;
  size_t sStack_38;
  
  sVar53 = CONCAT44(in_register_00000034,is_last);
  uVar21 = s->last_processed_pos_;
  if (uVar21 >> 0x1e < 3) {
    pBVar35 = (BrotliEncoderParams *)(uVar21 & 0xffffffff);
  }
  else {
    pBVar35 = (BrotliEncoderParams *)
              (ulong)(((int)((uint)uVar21 * 2) >> 1 & 0xc0000000U) + ((uint)uVar21 & 0x3fffffff) +
                     0x80000000);
  }
  uVar23 = s->input_pos_;
  local_16c = force_flush;
  local_130 = output;
  EnsureInitialized(s);
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  uVar52 = uVar23 - uVar21;
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  uVar3 = (s->ringbuffer_).mask_;
  ringbuffer_mask = (ulong)uVar3;
  pHVar50 = (H9 *)(s->ringbuffer_).buffer_;
  local_138 = out_size;
  EnsureInitialized(s);
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < uVar52) {
    return 0;
  }
  m = &s->memory_manager_;
  uVar29 = (s->params).quality;
  uVar31 = (uint)pBVar35;
  if (uVar29 == 1) {
    if (s->command_buf_ == (uint32_t *)0x0) {
      puVar19 = (uint32_t *)BrotliAllocate(m,0x80000);
      s->command_buf_ = puVar19;
      puVar20 = (uint8_t *)BrotliAllocate(m,0x20000);
      s->literal_buf_ = puVar20;
      uVar29 = (s->params).quality;
      goto LAB_0012ebdb;
    }
  }
  else {
LAB_0012ebdb:
    if (1 < uVar29) {
      uVar21 = s->num_commands_ + (uVar52 >> 1 & 0x7fffffff) + 1;
      if (s->cmd_alloc_size_ < uVar21) {
        sVar41 = (uVar52 >> 2 & 0x3fffffff) + uVar21 + 0x10;
        s->cmd_alloc_size_ = sVar41;
        if (sVar41 == 0) {
          pCVar22 = (Command *)0x0;
        }
        else {
          pCVar22 = (Command *)BrotliAllocate(m,sVar41 * 0x10);
        }
        if (s->commands_ != (Command *)0x0) {
          memcpy(pCVar22,s->commands_,s->num_commands_ << 4);
          BrotliFree(m,s->commands_);
        }
        s->commands_ = pCVar22;
        uVar29 = (s->params).quality;
      }
      puVar20 = (uint8_t *)(ulong)uVar29;
      local_168 = &s->hashers_;
      pBVar32 = (BrotliEncoderParams *)(uVar52 & 0xffffffff);
      iVar18 = (int)pHVar50;
      local_180 = pBVar32;
      if ((int)uVar29 < 10) {
        if (uVar29 == 4) {
          if ((s->params).size_hint < 0x100000) {
switchD_0012f214_caseD_4:
            InitH4((MemoryManager *)(s->hashers_).h4,(H4 *)pHVar50,(uint8_t *)pBVar35,pBVar32,sVar53
                   ,(size_t)pBVar32,iVar18);
            pHVar43 = pHVar50;
            if (((BrotliEncoderParams *)0x6 < pBVar32) && (2 < uVar31)) {
              pHVar24 = (H54 *)(s->hashers_).h4;
              uVar29 = uVar31 - 3;
              pHVar24->buckets_
              [(uint)((ulong)(*(long *)((long)pHVar50->num_ + (ulong)(uVar29 & uVar3)) *
                             -0x42e1ca5843000000) >> 0x2f) + (uVar29 >> 3 & 3)] = uVar29;
              uVar29 = uVar31 - 2;
              pHVar24->buckets_
              [(uint)((ulong)(*(long *)((long)pHVar50->num_ + (ulong)(uVar29 & uVar3)) *
                             -0x42e1ca5843000000) >> 0x2f) + (uVar29 >> 3 & 3)] = uVar29;
              uVar29 = (uint)((ulong)(*(long *)((long)pHVar50->num_ + (ulong)(uVar31 - 1 & uVar3)) *
                                     -0x42e1ca5843000000) >> 0x2f);
              goto LAB_0012f34b;
            }
          }
          else {
            InitH54((MemoryManager *)(s->hashers_).h54,(H54 *)pHVar50,(uint8_t *)pBVar35,pBVar32,
                    sVar53,(size_t)pBVar32,iVar18);
            pHVar43 = pHVar50;
            if (((BrotliEncoderParams *)0x6 < pBVar32) && (2 < uVar31)) {
              pHVar24 = (s->hashers_).h54;
              uVar29 = uVar31 - 3;
              pHVar24->buckets_
              [(uint)((ulong)(*(long *)((long)pHVar50->num_ + (ulong)(uVar29 & uVar3)) *
                             0x35a7bd1e35a7bd00) >> 0x2c) + (uVar29 >> 3 & 3)] = uVar29;
              uVar29 = uVar31 - 2;
              pHVar24->buckets_
              [(uint)((ulong)(*(long *)((long)pHVar50->num_ + (ulong)(uVar29 & uVar3)) *
                             0x35a7bd1e35a7bd00) >> 0x2c) + (uVar29 >> 3 & 3)] = uVar29;
              uVar29 = (uint)((ulong)(*(long *)((long)pHVar50->num_ + (ulong)(uVar31 - 1 & uVar3)) *
                                     0x35a7bd1e35a7bd00) >> 0x2c);
LAB_0012f34b:
              pHVar24->buckets_[uVar29 + (uVar31 - 1 >> 3 & 3)] = uVar31 - 1;
              pHVar43 = pHVar50;
            }
          }
        }
        else {
          uVar17 = uVar29;
          if ((((int)uVar29 < 5) || (0x10 < (s->params).lgwin)) ||
             (uVar17 = 0x2a - (uVar29 < 9), 6 < uVar29)) {
            switch(uVar17) {
            case 2:
              InitH2((MemoryManager *)local_168->h2,(H2 *)pHVar50,(uint8_t *)pBVar35,pBVar32,sVar53,
                     (size_t)pBVar32,iVar18);
              pHVar43 = pHVar50;
              if (((BrotliEncoderParams *)0x6 < pBVar32) && (2 < uVar31)) {
                pHVar8 = local_168->h2;
                pHVar8->buckets_
                [(ulong)(*(long *)((long)pHVar50->num_ + (ulong)(uVar31 - 3 & uVar3)) *
                        -0x42e1ca5843000000) >> 0x30] = uVar31 - 3;
                pHVar8->buckets_
                [(ulong)(*(long *)((long)pHVar50->num_ + (ulong)(uVar31 - 2 & uVar3)) *
                        -0x42e1ca5843000000) >> 0x30] = uVar31 - 2;
                pHVar8->buckets_
                [(ulong)(*(long *)((long)pHVar50->num_ + (ulong)(uVar31 - 1 & uVar3)) *
                        -0x42e1ca5843000000) >> 0x30] = uVar31 - 1;
              }
              break;
            case 3:
              InitH3((MemoryManager *)(s->hashers_).h3,(H3 *)pHVar50,(uint8_t *)pBVar35,pBVar32,
                     sVar53,(size_t)pBVar32,iVar18);
              pHVar43 = pHVar50;
              if (((BrotliEncoderParams *)0x6 < pBVar32) && (2 < uVar31)) {
                pHVar12 = (s->hashers_).h3;
                uVar29 = uVar31 - 3;
                *(uint *)((long)pHVar12->buckets_ +
                         (ulong)(((uint)(ushort)((ulong)(*(long *)((long)pHVar50->num_ +
                                                                  (ulong)(uVar29 & uVar3)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                 (uint)((uVar29 >> 3 & 1) != 0)) * 4)) = uVar29;
                uVar29 = uVar31 - 2;
                *(uint *)((long)pHVar12->buckets_ +
                         (ulong)(((uint)(ushort)((ulong)(*(long *)((long)pHVar50->num_ +
                                                                  (ulong)(uVar29 & uVar3)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                 (uint)((uVar29 >> 3 & 1) != 0)) * 4)) = uVar29;
                uVar31 = uVar31 - 1;
                *(uint *)((long)pHVar12->buckets_ +
                         (ulong)(((uint)(ushort)((ulong)(*(long *)((long)pHVar50->num_ +
                                                                  (ulong)(uVar31 & uVar3)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                 (uint)((uVar31 >> 3 & 1) != 0)) * 4)) = uVar31;
              }
              break;
            case 4:
              goto switchD_0012f214_caseD_4;
            case 5:
              InitH5((MemoryManager *)(s->hashers_).h5,(H5 *)pHVar50,(uint8_t *)pBVar35,pBVar32,
                     sVar53,(size_t)pBVar32,iVar18);
              pHVar43 = pHVar50;
              if (((BrotliEncoderParams *)0x2 < pBVar32) && (2 < uVar31)) {
                pHVar25 = (H8 *)(s->hashers_).h5;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 3 & uVar3)) *
                               0x1e35a7bd) >> 0x12;
                uVar39 = pHVar25->num_[uVar29];
                *(uint *)((long)pHVar25->num_ + (ulong)(uVar29 * 0x40 + (uVar39 & 0xf) * 4) + 0x8000
                         ) = uVar31 - 3;
                pHVar25->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 2 & uVar3)) *
                               0x1e35a7bd) >> 0x12;
                uVar39 = pHVar25->num_[uVar29];
                *(uint *)((long)pHVar25->num_ + (ulong)(uVar29 * 0x40 + (uVar39 & 0xf) * 4) + 0x8000
                         ) = uVar31 - 2;
                pHVar25->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 1 & uVar3)) *
                               0x1e35a7bd) >> 0x12;
                uVar21 = (ulong)uVar29;
                uVar39 = pHVar25->num_[uVar21];
                uVar17 = uVar39 & 0xf;
                iVar18 = uVar29 << 6;
LAB_0012f986:
                *(uint *)((long)pHVar25->num_ + (ulong)(iVar18 + uVar17 * 4) + 0x8000) = uVar31 - 1;
LAB_0012fc4d:
                pHVar25->num_[uVar21] = uVar39 + 1;
                pHVar43 = pHVar50;
              }
              break;
            case 6:
              InitH6((MemoryManager *)(s->hashers_).h6,(H6 *)pHVar50,(uint8_t *)pBVar35,pBVar32,
                     sVar53,(size_t)pBVar32,iVar18);
              pHVar43 = pHVar50;
              if (((BrotliEncoderParams *)0x2 < pBVar32) && (2 < uVar31)) {
                pHVar25 = (H8 *)(s->hashers_).h6;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 3 & uVar3)) *
                               0x1e35a7bd) >> 0x12;
                uVar39 = pHVar25->num_[uVar29];
                *(uint *)((long)pHVar25->num_ +
                         (ulong)(uVar29 * 0x80 + (uVar39 & 0x1f) * 4) + 0x8000) = uVar31 - 3;
                pHVar25->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 2 & uVar3)) *
                               0x1e35a7bd) >> 0x12;
                uVar39 = pHVar25->num_[uVar29];
                *(uint *)((long)pHVar25->num_ +
                         (ulong)(uVar29 * 0x80 + (uVar39 & 0x1f) * 4) + 0x8000) = uVar31 - 2;
                pHVar25->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 1 & uVar3)) *
                               0x1e35a7bd) >> 0x12;
                uVar21 = (ulong)uVar29;
                uVar39 = pHVar25->num_[uVar21];
                uVar17 = uVar39 & 0x1f;
                iVar18 = uVar29 << 7;
                goto LAB_0012f986;
              }
              break;
            case 7:
              InitH7((MemoryManager *)(s->hashers_).h7,(H7 *)pHVar50,(uint8_t *)pBVar35,pBVar32,
                     sVar53,(size_t)pBVar32,iVar18);
              pHVar43 = pHVar50;
              if (((BrotliEncoderParams *)0x2 < pBVar32) && (2 < uVar31)) {
                pHVar25 = (H8 *)(s->hashers_).h7;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 3 & uVar3)) *
                               0x1e35a7bd) >> 0x11;
                uVar39 = pHVar25->num_[uVar29];
                *(uint *)((long)pHVar25->buckets_ + (ulong)(uVar29 * 0x100 + (uVar39 & 0x3f) * 4)) =
                     uVar31 - 3;
                pHVar25->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 2 & uVar3)) *
                               0x1e35a7bd) >> 0x11;
                uVar39 = pHVar25->num_[uVar29];
                *(uint *)((long)pHVar25->buckets_ + (ulong)(uVar29 * 0x100 + (uVar39 & 0x3f) * 4)) =
                     uVar31 - 2;
                pHVar25->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 1 & uVar3)) *
                               0x1e35a7bd) >> 0x11;
                uVar21 = (ulong)uVar29;
                uVar39 = pHVar25->num_[uVar21];
                uVar17 = uVar39 & 0x3f;
                iVar18 = uVar29 << 8;
LAB_0012fc3e:
                *(uint *)((long)pHVar25->buckets_ + (ulong)(iVar18 + uVar17 * 4)) = uVar31 - 1;
                goto LAB_0012fc4d;
              }
              break;
            case 8:
              InitH8((MemoryManager *)(s->hashers_).h8,(H8 *)pHVar50,(uint8_t *)pBVar35,pBVar32,
                     sVar53,(size_t)pBVar32,iVar18);
              pHVar43 = pHVar50;
              if (((BrotliEncoderParams *)0x2 < pBVar32) && (2 < uVar31)) {
                pHVar25 = (s->hashers_).h8;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 3 & uVar3)) *
                               0x1e35a7bd) >> 0x11;
                uVar39 = pHVar25->num_[uVar29];
                *(uint *)((long)pHVar25->buckets_ + (ulong)(uVar29 * 0x200 + (uVar39 & 0x7f) * 4)) =
                     uVar31 - 3;
                pHVar25->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 2 & uVar3)) *
                               0x1e35a7bd) >> 0x11;
                uVar39 = pHVar25->num_[uVar29];
                *(uint *)((long)pHVar25->buckets_ + (ulong)(uVar29 * 0x200 + (uVar39 & 0x7f) * 4)) =
                     uVar31 - 2;
                pHVar25->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 1 & uVar3)) *
                               0x1e35a7bd) >> 0x11;
                uVar21 = (ulong)uVar29;
                uVar39 = pHVar25->num_[uVar21];
                uVar17 = uVar39 & 0x7f;
                iVar18 = uVar29 << 9;
                goto LAB_0012fc3e;
              }
              break;
            case 9:
              InitH9((MemoryManager *)(s->hashers_).h9,pHVar50,(uint8_t *)pBVar35,pBVar32,sVar53,
                     (size_t)pBVar32,iVar18);
              pHVar43 = pHVar50;
              if (((BrotliEncoderParams *)0x2 < pBVar32) && (2 < uVar31)) {
                pHVar5 = (s->hashers_).h9;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 3 & uVar3)) *
                               0x1e35a7bd) >> 0x11;
                uVar39 = pHVar5->num_[uVar29];
                *(uint *)((long)pHVar5->buckets_ + (ulong)(uVar29 * 0x400 + (uVar39 & 0xff) * 4)) =
                     uVar31 - 3;
                pHVar5->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 2 & uVar3)) *
                               0x1e35a7bd) >> 0x11;
                uVar39 = pHVar5->num_[uVar29];
                *(uint *)((long)pHVar5->buckets_ + (ulong)(uVar29 * 0x400 + (uVar39 & 0xff) * 4)) =
                     uVar31 - 2;
                pHVar5->num_[uVar29] = uVar39 + 1;
                uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)(uVar31 - 1 & uVar3)) *
                               0x1e35a7bd) >> 0x11;
                uVar39 = pHVar5->num_[uVar29];
                *(uint *)((long)pHVar5->buckets_ + (ulong)(uVar29 * 0x400 + (uVar39 & 0xff) * 4)) =
                     uVar31 - 1;
                pHVar5->num_[uVar29] = uVar39 + 1;
              }
              break;
            default:
              if (uVar17 == 0x29) {
                InitH41((MemoryManager *)(s->hashers_).h41,(H41 *)pHVar50,puVar20,pBVar35,
                        (size_t)pBVar32,sVar53,iVar18);
                pHVar43 = pHVar50;
                if (((BrotliEncoderParams *)0x2 < pBVar32) && (2 < uVar31)) {
                  pHVar27 = (H40 *)(s->hashers_).h41;
                  goto LAB_0012f5be;
                }
              }
              else {
                pHVar43 = pHVar50;
                if (((uVar17 == 0x2a) &&
                    (InitH42((MemoryManager *)(s->hashers_).h42,(H42 *)pHVar50,puVar20,pBVar35,
                             (size_t)pBVar32,sVar53,iVar18), pHVar43 = pHVar50,
                    (BrotliEncoderParams *)0x2 < pBVar32)) && (2 < uVar31)) {
                  pHVar10 = (s->hashers_).h42;
                  puVar1 = &pBVar35[-1].field_0x1d;
                  uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)((uint)puVar1 & uVar3)) *
                                 0x1e35a7bd) >> 0x11;
                  uVar31 = uVar29 & 0x1ff;
                  uVar39 = pHVar10->free_slot_idx[uVar31];
                  pHVar10->free_slot_idx[uVar31] = uVar39 + 1;
                  uVar21 = (ulong)uVar39 & 0x1ff;
                  uVar23 = (long)puVar1 - (ulong)pHVar10->addr[uVar29];
                  pHVar10->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar29;
                  if (0xfffe < uVar23) {
                    uVar23 = 0xffff;
                  }
                  *(short *)((long)&pHVar10->banks[0].slots[uVar21].delta + (ulong)(uVar31 << 0xb))
                       = (short)uVar23;
                  *(uint16_t *)
                   ((long)&pHVar10->banks[0].slots[uVar21].next + (ulong)(uVar31 << 0xb)) =
                       pHVar10->head[uVar29];
                  pHVar10->addr[uVar29] = (uint)puVar1;
                  pHVar10->head[uVar29] = (uint16_t)uVar21;
                  puVar1 = &pBVar35[-1].field_0x1e;
                  uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)((uint)puVar1 & uVar3)) *
                                 0x1e35a7bd) >> 0x11;
                  uVar31 = uVar29 & 0x1ff;
                  uVar39 = pHVar10->free_slot_idx[uVar31];
                  pHVar10->free_slot_idx[uVar31] = uVar39 + 1;
                  uVar23 = (ulong)uVar39 & 0x1ff;
                  uVar21 = (long)puVar1 - (ulong)pHVar10->addr[uVar29];
                  pHVar10->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar29;
                  if (0xfffe < uVar21) {
                    uVar21 = 0xffff;
                  }
                  *(short *)((long)&pHVar10->banks[0].slots[uVar23].delta + (ulong)(uVar31 << 0xb))
                       = (short)uVar21;
                  *(uint16_t *)
                   ((long)&pHVar10->banks[0].slots[uVar23].next + (ulong)(uVar31 << 0xb)) =
                       pHVar10->head[uVar29];
                  pHVar10->addr[uVar29] = (uint)puVar1;
                  pHVar10->head[uVar29] = (uint16_t)uVar23;
                  puVar1 = &pBVar35[-1].field_0x1f;
                  uVar31 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)((uint)puVar1 & uVar3)) *
                                 0x1e35a7bd) >> 0x11;
                  uVar29 = uVar31 & 0x1ff;
                  uVar39 = pHVar10->free_slot_idx[uVar29];
                  pHVar10->free_slot_idx[uVar29] = uVar39 + 1;
                  uVar21 = (ulong)uVar39 & 0x1ff;
                  uVar23 = (long)puVar1 - (ulong)pHVar10->addr[uVar31];
                  pHVar10->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar31;
                  if (0xfffe < uVar23) {
                    uVar23 = 0xffff;
                  }
                  *(short *)((long)&pHVar10->banks[0].slots[uVar21].delta + (ulong)(uVar29 << 0xb))
                       = (short)uVar23;
                  *(uint16_t *)
                   ((long)&pHVar10->banks[0].slots[uVar21].next + (ulong)(uVar29 << 0xb)) =
                       pHVar10->head[uVar31];
                  pHVar10->addr[uVar31] = (uint)puVar1;
                  pHVar10->head[uVar31] = (uint16_t)uVar21;
                }
              }
            }
          }
          else {
            InitH40((MemoryManager *)(s->hashers_).h40,(H40 *)pHVar50,puVar20,pBVar35,
                    (size_t)pBVar32,sVar53,iVar18);
            pHVar43 = pHVar50;
            if (((BrotliEncoderParams *)0x2 < pBVar32) && (2 < uVar31)) {
              pHVar27 = (s->hashers_).h40;
LAB_0012f5be:
              puVar1 = &pBVar35[-1].field_0x1d;
              uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)((uint)puVar1 & uVar3)) *
                             0x1e35a7bd) >> 0x11;
              uVar39 = pHVar27->free_slot_idx[0];
              uVar44 = uVar39 + 1;
              pHVar27->free_slot_idx[0] = uVar44;
              uVar21 = (long)puVar1 - (ulong)pHVar27->addr[uVar29];
              if (0xfffe < uVar21) {
                uVar21 = 0xffff;
              }
              pHVar27->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar29;
              pHVar27->banks[0].slots[uVar39].delta = (uint16_t)uVar21;
              pHVar27->banks[0].slots[uVar39].next = pHVar27->head[uVar29];
              pHVar27->addr[uVar29] = (uint)puVar1;
              pHVar27->head[uVar29] = uVar39;
              puVar1 = &pBVar35[-1].field_0x1e;
              uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)((uint)puVar1 & uVar3)) *
                             0x1e35a7bd) >> 0x11;
              uVar38 = uVar39 + 2;
              pHVar27->free_slot_idx[0] = uVar38;
              uVar21 = (long)puVar1 - (ulong)pHVar27->addr[uVar29];
              pHVar27->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar29;
              if (0xfffe < uVar21) {
                uVar21 = 0xffff;
              }
              pHVar27->banks[0].slots[uVar44].delta = (uint16_t)uVar21;
              pHVar27->banks[0].slots[uVar44].next = pHVar27->head[uVar29];
              pHVar27->addr[uVar29] = (uint)puVar1;
              pHVar27->head[uVar29] = uVar44;
              puVar1 = &pBVar35[-1].field_0x1f;
              uVar29 = (uint)(*(int *)((long)pHVar50->num_ + (ulong)((uint)puVar1 & uVar3)) *
                             0x1e35a7bd) >> 0x11;
              pHVar27->free_slot_idx[0] = uVar39 + 3;
              uVar21 = (long)puVar1 - (ulong)pHVar27->addr[uVar29];
              if (0xfffe < uVar21) {
                uVar21 = 0xffff;
              }
              pHVar27->tiny_hash[(ulong)puVar1 & 0xffff] = (uint8_t)uVar29;
              pHVar27->banks[0].slots[uVar38].delta = (uint16_t)uVar21;
              pHVar27->banks[0].slots[uVar38].next = pHVar27->head[uVar29];
              pHVar27->addr[uVar29] = (uint)puVar1;
              pHVar27->head[uVar29] = uVar38;
              pHVar43 = pHVar50;
            }
          }
        }
      }
      else {
        InitH10(m,(s->hashers_).h10,(uint8_t *)s,pBVar35,(size_t)pBVar32,sVar53,iVar18);
        pHVar43 = pHVar50;
        if (((BrotliEncoderParams *)0x2 < pBVar32) && (0x7f < uVar31)) {
          pHVar4 = (s->hashers_).h10;
          pBVar32 = (BrotliEncoderParams *)((long)&pBVar35[-4].mode + 1);
          local_148 = (BrotliEncoderParams *)
                      ((undefined1 *)((long)&local_180[-4].mode + 1) + (long)&pBVar35->mode);
          if (pBVar35 < local_148) {
            local_148 = pBVar35;
          }
          uVar21 = pHVar4->window_mask_;
          local_140 = pBVar35;
          local_128 = uVar21;
          do {
            uVar23 = (long)local_140 - (long)pBVar32;
            if (uVar23 < 0x10) {
              uVar23 = 0xf;
            }
            uVar52 = (ulong)((uint)pBVar32 & uVar3);
            uVar29 = (uint)(*(int *)((long)pHVar50->num_ + uVar52) * 0x1e35a7bd) >> 0xf;
            pBVar35 = (BrotliEncoderParams *)(ulong)pHVar4->buckets_[uVar29];
            local_1a0 = (uVar21 & (ulong)pBVar32) * 2 + 1;
            local_1a8 = (uVar21 & (ulong)pBVar32) * 2;
            pHVar4->buckets_[uVar29] = (uint)pBVar32;
            if (pBVar32 != pBVar35) {
              local_160 = uVar21 - uVar23;
              local_178 = (int *)((long)pHVar50->num_ + uVar52);
              lVar54 = 0x40;
              uVar23 = 0;
              uVar52 = 0;
              local_188 = pBVar32;
LAB_0012ef28:
              bVar55 = lVar54 != 0;
              lVar54 = lVar54 + -1;
              pBVar32 = local_188;
              if (((ulong)((long)local_188 - (long)pBVar35) <= local_160) && (bVar55)) {
                uVar21 = uVar52;
                if (uVar23 < uVar52) {
                  uVar21 = uVar23;
                }
                if (0x80 < uVar21) {
                  __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                                ,0x9d,
                                "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                               );
                }
                uVar29 = (uint)pBVar35;
                puVar40 = (uint8_t *)((long)pHVar50->num_ + (ulong)(uVar29 & uVar3));
                puVar20 = puVar40 + uVar21;
                uVar42 = 0x80 - uVar21;
                if (uVar21 < 0x79) {
                  uVar37 = (ulong)((uint)uVar42 & 0xf8);
                  lVar47 = 0;
                  uVar48 = 0;
LAB_0012ef99:
                  if (*(ulong *)(puVar20 + uVar48 * 8) ==
                      *(ulong *)((long)local_178 + uVar48 * 8 + uVar21)) goto code_r0x0012efa6;
                  uVar37 = *(ulong *)((long)local_178 + uVar48 * 8 + uVar21) ^
                           *(ulong *)(puVar20 + uVar48 * 8);
                  uVar42 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar48 = (uVar42 >> 3 & 0x1fffffff) - lVar47;
                  goto LAB_0012efd1;
                }
                uVar37 = 0;
                goto LAB_0012f06f;
              }
            }
LAB_0012eebd:
            uVar46 = pHVar4->invalid_pos_;
            puVar19 = pHVar4->forest_;
            puVar19[local_1a8] = uVar46;
            puVar19[local_1a0] = uVar46;
LAB_0012eedf:
            pBVar32 = (BrotliEncoderParams *)((long)&pBVar32->mode + 1);
            pBVar35 = local_140;
          } while (pBVar32 < local_148);
        }
      }
      psVar36 = &s->num_commands_;
      iVar18 = (s->params).quality;
      if (iVar18 == 0xb) {
        BrotliCreateHqZopfliBackwardReferences
                  (m,(size_t)local_180,(size_t)pBVar35,(uint8_t *)pHVar50,ringbuffer_mask,&s->params
                   ,(s->hashers_).h10,s->dist_cache_,&s->last_insert_len_,
                   s->commands_ + s->num_commands_,psVar36,&s->num_literals_);
      }
      else if (iVar18 == 10) {
        BrotliCreateZopfliBackwardReferences
                  (m,(size_t)local_180,(size_t)pBVar35,(uint8_t *)pHVar50,ringbuffer_mask,&s->params
                   ,(s->hashers_).h10,s->dist_cache_,&s->last_insert_len_,
                   s->commands_ + s->num_commands_,psVar36,&s->num_literals_);
      }
      else {
        BrotliCreateBackwardReferences
                  ((size_t)local_180,(size_t)pBVar35,(uint8_t *)pHVar50,ringbuffer_mask,&s->params,
                   local_168,s->dist_cache_,&s->last_insert_len_,s->commands_ + s->num_commands_,
                   psVar36,&s->num_literals_);
      }
      iVar18 = (s->params).lgwin;
      iVar33 = (s->params).lgblock;
      if (iVar33 < iVar18) {
        iVar33 = iVar18;
      }
      cVar28 = '\x17';
      if (iVar33 < 0x17) {
        cVar28 = (char)iVar33;
      }
      uVar21 = 1L << (cVar28 + 1U & 0x3f);
      uVar6 = s->input_pos_;
      uVar7 = s->last_flush_pos_;
      EnsureInitialized(s);
      if ((s->params).quality < 4) {
        bVar55 = 0x2ffe < s->num_commands_ + s->num_literals_;
      }
      else {
        bVar55 = false;
      }
      if ((((local_16c != 0 || is_last != 0) || (bVar55)) ||
          (uVar21 < (uVar6 - uVar7) + (1L << ((byte)(s->params).lgblock & 0x3f)))) ||
         ((uVar21 = uVar21 >> 3, uVar21 <= s->num_literals_ || (uVar21 <= *psVar36)))) {
        uVar21 = s->last_insert_len_;
        if (uVar21 != 0) {
          pCVar22 = s->commands_;
          sVar53 = s->num_commands_;
          s->num_commands_ = sVar53 + 1;
          pCVar22[sVar53].insert_len_ = (uint32_t)uVar21;
          pCVar22[sVar53].copy_len_ = 0x4000000;
          pCVar22[sVar53].dist_extra_ = 0;
          pCVar22[sVar53].dist_prefix_ = 0x10;
          if (uVar21 < 6) {
            uVar23 = uVar21 & 0xffffffff;
          }
          else if (uVar21 < 0x82) {
            uVar29 = 0x1f;
            uVar31 = (uint)(uVar21 - 2);
            if (uVar31 != 0) {
              for (; uVar31 >> uVar29 == 0; uVar29 = uVar29 - 1) {
              }
            }
            uVar23 = (ulong)((int)(uVar21 - 2 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar29 ^ 0xffffffe0) * 2 + 0x40);
          }
          else if (uVar21 < 0x842) {
            uVar31 = (uint32_t)uVar21 - 0x42;
            uVar29 = 0x1f;
            if (uVar31 != 0) {
              for (; uVar31 >> uVar29 == 0; uVar29 = uVar29 - 1) {
              }
            }
            uVar23 = (ulong)((uVar29 ^ 0xffe0) + 0x2a);
          }
          else {
            uVar23 = 0x15;
            if (0x1841 < uVar21) {
              uVar23 = (ulong)(ushort)(0x17 - (uVar21 < 0x5842));
            }
          }
          pCVar22[sVar53].cmd_prefix_ =
               (short)uVar23 * 8 & 0x38U |
               *(ushort *)
                (CombineLengthCodes_cells + (ulong)(uint)((int)((uVar23 & 0xffff) >> 3) * 3) * 2) |
               2;
          s->num_literals_ = s->num_literals_ + uVar21;
          s->last_insert_len_ = 0;
        }
        uVar21 = s->input_pos_;
        uVar23 = s->last_flush_pos_;
        if (uVar21 == uVar23 && is_last == 0) {
          *local_138 = 0;
          return 1;
        }
        if (uVar21 < uVar23) {
          __assert_fail("s->input_pos_ >= s->last_flush_pos_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                        ,0x3bf,
                        "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                       );
        }
        uVar52 = uVar21 - uVar23;
        if ((uVar21 < uVar23 || uVar52 == 0) && is_last == 0) {
          __assert_fail("s->input_pos_ > s->last_flush_pos_ || is_last",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                        ,0x3c0,
                        "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                       );
        }
        if (0x1000000 < uVar52) {
          __assert_fail("s->input_pos_ - s->last_flush_pos_ <= 1u << 24",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                        ,0x3c1,
                        "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                       );
        }
        puVar20 = GetBrotliStorage(s,uVar52 * 2 + 0x1f6);
        bVar2 = s->last_byte_bits_;
        storage_ix_1 = (size_t)bVar2;
        *puVar20 = s->last_byte_;
        uVar42 = s->last_flush_pos_;
        uVar29 = (uint)uVar42;
        if (0xbfffffff < uVar42) {
          uVar29 = ((int)(uVar29 * 2) >> 1 & 0xc0000000U) + (uVar29 & 0x3fffffff) + 0x80000000;
        }
        pBVar35 = (BrotliEncoderParams *)s->saved_dist_cache_;
        local_178 = s->dist_cache_;
        pHVar50 = pHVar43;
        local_190 = psVar36;
        if (uVar21 == uVar23) {
          *(ulong *)(puVar20 + (bVar2 >> 3)) = 3L << (bVar2 & 7) | (ulong)puVar20[bVar2 >> 3];
          storage_ix_1 = (size_t)(bVar2 + 9 & 0xfffffff8);
          ppuVar51 = local_130;
        }
        else {
          local_160 = CONCAT71(local_160._1_7_,s->prev_byte_);
          local_188 = (BrotliEncoderParams *)CONCAT71(local_188._1_7_,s->prev_byte2_);
          pCVar22 = s->commands_;
          sVar53 = s->num_commands_;
          iVar18 = ShouldCompress((uint8_t *)pHVar43,ringbuffer_mask,uVar42,uVar52,s->num_literals_,
                                  sVar53);
          if (iVar18 == 0) {
            uVar15 = *(undefined8 *)(s->saved_dist_cache_ + 2);
            *(undefined8 *)local_178 = *(undefined8 *)pBVar35;
            *(undefined8 *)(local_178 + 2) = uVar15;
            BrotliStoreUncompressedMetaBlock
                      (is_last,(uint8_t *)pHVar43,(ulong)uVar29,ringbuffer_mask,uVar52,&storage_ix_1
                       ,puVar20);
            psVar36 = local_190;
            ppuVar51 = local_130;
          }
          else {
            local_16c = CONCAT31(local_16c._1_3_,*puVar20);
            local_128 = storage_ix_1 & 0xff;
            iVar18 = (s->params).quality;
            pBVar32 = (BrotliEncoderParams *)0x0;
            pBVar34 = (BrotliEncoderParams *)0x0;
            if (iVar18 < 10) {
LAB_001301f3:
              if (iVar18 < 3) {
                BrotliStoreMetaBlockFast
                          (m,(uint8_t *)pHVar43,(ulong)uVar29,uVar52,ringbuffer_mask,is_last,pCVar22
                           ,sVar53,&storage_ix_1,puVar20);
                psVar36 = local_190;
              }
              else {
                if (iVar18 != 3) goto LAB_001304b0;
                BrotliStoreMetaBlockTrivial
                          (m,(uint8_t *)pHVar43,(ulong)uVar29,uVar52,ringbuffer_mask,is_last,pCVar22
                           ,sVar53,&storage_ix_1,puVar20);
                psVar36 = local_190;
              }
            }
            else {
              pBVar32 = (BrotliEncoderParams *)0x0;
              pBVar34 = (BrotliEncoderParams *)0x0;
              if ((s->params).mode == BROTLI_MODE_FONT) {
                if (sVar53 != 0) {
                  puVar26 = &pCVar22->dist_prefix_;
                  sVar41 = sVar53;
                  do {
                    if (((*(uint *)(puVar26 + -5) & 0xffffff) != 0) && (0x7f < puVar26[-1])) {
                      uVar39 = *puVar26;
                      uVar31 = (uint)uVar39;
                      if (0xf < uVar39) {
                        uVar31 = *(uint *)(puVar26 + -3);
                        uVar31 = ((uint)uVar39 + (uVar31 >> 0x18) * -2 + -0xc <<
                                 ((byte)(uVar31 >> 0x18) & 0x1f)) + (uVar31 & 0xffffff) + 0xc;
                      }
                      if (uVar31 < 0x1c) {
                        uVar46 = 0;
                      }
                      else {
                        uVar21 = (ulong)uVar31;
                        uVar17 = 0x1f;
                        uVar45 = (uint)(uVar21 - 0x14);
                        if (uVar45 != 0) {
                          for (; uVar45 >> uVar17 == 0; uVar17 = uVar17 - 1) {
                          }
                        }
                        uVar30 = (uVar17 ^ 0xffffffe0) + 0x1f;
                        bVar55 = (uVar45 >> (uVar30 & 0x1f) & 1) != 0;
                        uVar31 = (uVar31 & 1) + (uint)bVar55 * 2 + (uVar17 ^ 0xffffffe0) * 4 + 0x90;
                        uVar46 = (uint)((uVar21 - 0x14) -
                                        ((ulong)bVar55 + 2 << ((byte)uVar30 & 0x3f)) >> 1) |
                                 uVar30 * 0x1000000 - 0x1000000;
                      }
                      *puVar26 = (ushort)uVar31;
                      *(uint32_t *)(puVar26 + -3) = uVar46;
                      pHVar43 = pHVar50;
                    }
                    puVar26 = puVar26 + 8;
                    sVar41 = sVar41 - 1;
                  } while (sVar41 != 0);
                  iVar18 = (s->params).quality;
                  pBVar34 = (BrotliEncoderParams *)0x1;
                  pBVar32 = (BrotliEncoderParams *)0xc;
                  goto LAB_001301f3;
                }
                pBVar34 = (BrotliEncoderParams *)0x1;
                pBVar32 = (BrotliEncoderParams *)0xc;
              }
LAB_001304b0:
              local_14c = CONTEXT_UTF8;
              local_148 = pBVar34;
              local_140 = pBVar32;
              BrotliInitBlockSplit((BlockSplit *)&storage_ix);
              BrotliInitBlockSplit(&local_e0);
              BrotliInitBlockSplit(&local_b0);
              local_40 = (HistogramDistance *)0x0;
              sStack_38 = 0;
              local_50 = (HistogramCommand *)0x0;
              sStack_48 = 0;
              local_60 = (HistogramLiteral *)0x0;
              sStack_58 = 0;
              local_70 = (uint32_t *)0x0;
              sStack_68 = 0;
              local_80 = (uint32_t *)0x0;
              sStack_78 = 0;
              iVar18 = (s->params).quality;
              pBVar32 = (BrotliEncoderParams *)((ulong)local_188 & 0xff);
              bVar2 = (byte)local_160;
              local_160 = CONCAT44(local_160._4_4_,(uint)(byte)local_160);
              local_188 = pBVar32;
              local_180 = pBVar35;
              if (iVar18 < 10) {
                table_size = 1;
                local_118 = (uint32_t *)0x0;
                pHVar43 = pHVar50;
                if ((s->params).disable_literal_context_modeling == 0) {
                  DecideOverLiteralContextModeling
                            ((uint8_t *)pHVar50,(ulong)uVar29,uVar52,ringbuffer_mask,iVar18,
                             &local_14c,&table_size,&local_118);
                  prev_byte2 = (uint8_t)local_188;
                  literal_context_mode = local_14c;
                }
                else {
                  prev_byte2 = (uint8_t)local_188;
                  literal_context_mode = CONTEXT_UTF8;
                }
                psVar36 = local_190;
                BrotliBuildMetaBlockGreedy
                          (m,(uint8_t *)pHVar50,(ulong)uVar29,ringbuffer_mask,bVar2,prev_byte2,
                           literal_context_mode,table_size,local_118,pCVar22,sVar53,
                           (MetaBlockSplit *)&storage_ix);
                pHVar50 = pHVar43;
              }
              else {
                local_120 = (size_t)uVar29;
                iVar18 = BrotliIsMostlyUTF8((uint8_t *)pHVar50,local_120,ringbuffer_mask,uVar52,0.75
                                           );
                literal_context_mode = (iVar18 == 0) + CONTEXT_UTF8;
                BrotliBuildMetaBlock
                          (m,(uint8_t *)pHVar50,local_120,ringbuffer_mask,&s->params,bVar2,
                           (uint8_t)local_188,pCVar22,sVar53,literal_context_mode,
                           (MetaBlockSplit *)&storage_ix);
                psVar36 = local_190;
              }
              if (3 < (s->params).quality) {
                BrotliOptimizeHistograms
                          ((ulong)local_140 & 0xffffffff,(ulong)local_148 & 0xffffffff,
                           (MetaBlockSplit *)&storage_ix);
              }
              BrotliStoreMetaBlock
                        (m,(uint8_t *)pHVar50,(ulong)uVar29,uVar52,ringbuffer_mask,
                         (uint8_t)local_160,(uint8_t)local_188,is_last,(uint32_t)local_140,
                         (uint32_t)local_148,literal_context_mode,pCVar22,sVar53,
                         (MetaBlockSplit *)&storage_ix,&storage_ix_1,puVar20);
              BrotliDestroyBlockSplit(m,(BlockSplit *)&storage_ix);
              BrotliDestroyBlockSplit(m,&local_e0);
              BrotliDestroyBlockSplit(m,&local_b0);
              BrotliFree(m,local_80);
              local_80 = (uint32_t *)0x0;
              BrotliFree(m,local_70);
              local_70 = (uint32_t *)0x0;
              BrotliFree(m,local_60);
              local_60 = (HistogramLiteral *)0x0;
              BrotliFree(m,local_50);
              local_50 = (HistogramCommand *)0x0;
              BrotliFree(m,local_40);
              pBVar35 = local_180;
            }
            ppuVar51 = local_130;
            if (uVar52 + 4 < storage_ix_1 >> 3) {
              iVar18 = pBVar35->quality;
              iVar33 = pBVar35->lgwin;
              iVar16 = pBVar35->lgblock;
              local_178[0] = pBVar35->mode;
              local_178[1] = iVar18;
              local_178[2] = iVar33;
              local_178[3] = iVar16;
              *puVar20 = (uint8_t)local_16c;
              storage_ix_1 = local_128;
              BrotliStoreUncompressedMetaBlock
                        (is_last,(uint8_t *)pHVar50,(ulong)uVar29,ringbuffer_mask,uVar52,
                         &storage_ix_1,puVar20);
            }
          }
        }
        sVar53 = storage_ix_1 >> 3;
        s->last_byte_ = puVar20[sVar53];
        s->last_byte_bits_ = (byte)storage_ix_1 & 7;
        s->last_flush_pos_ = s->input_pos_;
        iVar18 = UpdateLastProcessedPos(s);
        if (iVar18 != 0) {
          uVar29 = (s->params).quality;
          if ((int)uVar29 < 10) {
            if (uVar29 == 4) {
              if ((s->params).size_hint < 0x100000) {
switchD_0013035d_caseD_4:
                pHVar9 = (s->hashers_).h4;
                pHVar9->is_dirty_ = 1;
                (pHVar9->dict_search_stats_).num_lookups = 0;
                (pHVar9->dict_search_stats_).num_matches = 0;
              }
              else {
                pHVar24 = (s->hashers_).h54;
                pHVar24->is_dirty_ = 1;
                (pHVar24->dict_search_stats_).num_lookups = 0;
                (pHVar24->dict_search_stats_).num_matches = 0;
              }
            }
            else {
              uVar31 = uVar29;
              if ((((int)uVar29 < 5) || (0x10 < (s->params).lgwin)) ||
                 (uVar31 = 0x2a - (uVar29 < 9), 6 < uVar29)) {
                switch(uVar31) {
                case 2:
                  pHVar8 = local_168->h2;
                  pHVar8->is_dirty_ = 1;
                  (pHVar8->dict_search_stats_).num_lookups = 0;
                  (pHVar8->dict_search_stats_).num_matches = 0;
                  break;
                case 3:
                  pHVar12 = (s->hashers_).h3;
                  pHVar12->is_dirty_ = 1;
                  (pHVar12->dict_search_stats_).num_lookups = 0;
                  (pHVar12->dict_search_stats_).num_matches = 0;
                  break;
                case 4:
                  goto switchD_0013035d_caseD_4;
                case 5:
                  pHVar13 = (s->hashers_).h5;
                  pHVar13->is_dirty_ = 1;
                  (pHVar13->dict_search_stats_).num_lookups = 0;
                  (pHVar13->dict_search_stats_).num_matches = 0;
                  break;
                case 6:
                  pHVar11 = (s->hashers_).h6;
                  pHVar11->is_dirty_ = 1;
                  (pHVar11->dict_search_stats_).num_lookups = 0;
                  (pHVar11->dict_search_stats_).num_matches = 0;
                  break;
                case 7:
                  pHVar14 = (s->hashers_).h7;
                  pHVar14->is_dirty_ = 1;
                  (pHVar14->dict_search_stats_).num_lookups = 0;
                  (pHVar14->dict_search_stats_).num_matches = 0;
                  break;
                case 8:
                  pHVar25 = (s->hashers_).h8;
                  pHVar25->is_dirty_ = 1;
                  (pHVar25->dict_search_stats_).num_lookups = 0;
                  (pHVar25->dict_search_stats_).num_matches = 0;
                  break;
                case 9:
                  pHVar43 = (s->hashers_).h9;
                  pHVar43->is_dirty_ = 1;
                  (pHVar43->dict_search_stats_).num_lookups = 0;
                  (pHVar43->dict_search_stats_).num_matches = 0;
                  break;
                default:
                  if (uVar31 == 0x29) {
                    pHVar27 = (H40 *)(s->hashers_).h41;
                    goto LAB_0013084a;
                  }
                  if (uVar31 == 0x2a) {
                    pHVar10 = (s->hashers_).h42;
                    pHVar10->is_dirty_ = 1;
                    (pHVar10->dict_search_stats_).num_lookups = 0;
                    (pHVar10->dict_search_stats_).num_matches = 0;
                  }
                }
              }
              else {
                pHVar27 = (s->hashers_).h40;
LAB_0013084a:
                pHVar27->is_dirty_ = 1;
                (pHVar27->dict_search_stats_).num_lookups = 0;
                (pHVar27->dict_search_stats_).num_matches = 0;
              }
            }
          }
          else {
            ((s->hashers_).h10)->is_dirty_ = 1;
          }
        }
        uVar6 = s->last_flush_pos_;
        if (uVar6 != 0) {
          s->prev_byte_ = *(uint8_t *)((long)pHVar50->num_ + (ulong)(uVar3 & (int)uVar6 - 1U));
          if (uVar6 != 1) {
            s->prev_byte2_ = *(uint8_t *)((long)pHVar50->num_ + (ulong)(uVar3 & (int)uVar6 - 2U));
          }
        }
        *psVar36 = 0;
        psVar36[1] = 0;
        iVar18 = local_178[1];
        iVar33 = local_178[2];
        iVar16 = local_178[3];
        pBVar35->mode = local_178[0];
        pBVar35->quality = iVar18;
        pBVar35->lgwin = iVar33;
        pBVar35->lgblock = iVar16;
        *ppuVar51 = puVar20;
        goto LAB_0013094a;
      }
      iVar18 = UpdateLastProcessedPos(s);
      if (iVar18 == 0) goto LAB_00130a59;
      uVar3 = (s->params).quality;
      if (9 < (int)uVar3) {
        ((s->hashers_).h10)->is_dirty_ = 1;
        goto LAB_00130a59;
      }
      if (uVar3 == 4) {
        if (0xfffff < (s->params).size_hint) {
          pHVar24 = (s->hashers_).h54;
          pHVar24->is_dirty_ = 1;
          (pHVar24->dict_search_stats_).num_lookups = 0;
          (pHVar24->dict_search_stats_).num_matches = 0;
          goto LAB_00130a59;
        }
switchD_0013044c_caseD_4:
        pHVar9 = (s->hashers_).h4;
        pHVar9->is_dirty_ = 1;
        (pHVar9->dict_search_stats_).num_lookups = 0;
        (pHVar9->dict_search_stats_).num_matches = 0;
        goto LAB_00130a59;
      }
      uVar29 = uVar3;
      if ((((int)uVar3 < 5) || (0x10 < (s->params).lgwin)) ||
         (uVar29 = 0x2a - (uVar3 < 9), 6 < uVar3)) {
        switch(uVar29) {
        case 2:
          pHVar8 = local_168->h2;
          pHVar8->is_dirty_ = 1;
          (pHVar8->dict_search_stats_).num_lookups = 0;
          (pHVar8->dict_search_stats_).num_matches = 0;
          break;
        case 3:
          pHVar12 = (s->hashers_).h3;
          pHVar12->is_dirty_ = 1;
          (pHVar12->dict_search_stats_).num_lookups = 0;
          (pHVar12->dict_search_stats_).num_matches = 0;
          break;
        case 4:
          goto switchD_0013044c_caseD_4;
        case 5:
          pHVar13 = (s->hashers_).h5;
          pHVar13->is_dirty_ = 1;
          (pHVar13->dict_search_stats_).num_lookups = 0;
          (pHVar13->dict_search_stats_).num_matches = 0;
          break;
        case 6:
          pHVar11 = (s->hashers_).h6;
          pHVar11->is_dirty_ = 1;
          (pHVar11->dict_search_stats_).num_lookups = 0;
          (pHVar11->dict_search_stats_).num_matches = 0;
          break;
        case 7:
          pHVar14 = (s->hashers_).h7;
          pHVar14->is_dirty_ = 1;
          (pHVar14->dict_search_stats_).num_lookups = 0;
          (pHVar14->dict_search_stats_).num_matches = 0;
          break;
        case 8:
          pHVar25 = (s->hashers_).h8;
          pHVar25->is_dirty_ = 1;
          (pHVar25->dict_search_stats_).num_lookups = 0;
          (pHVar25->dict_search_stats_).num_matches = 0;
          break;
        case 9:
          pHVar50 = (s->hashers_).h9;
          pHVar50->is_dirty_ = 1;
          (pHVar50->dict_search_stats_).num_lookups = 0;
          (pHVar50->dict_search_stats_).num_matches = 0;
          break;
        default:
          if (uVar29 != 0x29) {
            if (uVar29 == 0x2a) {
              pHVar10 = (s->hashers_).h42;
              pHVar10->is_dirty_ = 1;
              (pHVar10->dict_search_stats_).num_lookups = 0;
              (pHVar10->dict_search_stats_).num_matches = 0;
            }
            break;
          }
          pHVar27 = (H40 *)(s->hashers_).h41;
          goto LAB_001309a3;
        }
      }
      else {
        pHVar27 = (s->hashers_).h40;
LAB_001309a3:
        pHVar27->is_dirty_ = 1;
        (pHVar27->dict_search_stats_).num_lookups = 0;
        (pHVar27->dict_search_stats_).num_matches = 0;
      }
LAB_00130a59:
      *local_138 = 0;
      return 1;
    }
  }
  storage_ix = (size_t)s->last_byte_bits_;
  if (is_last == 0 && uVar23 == uVar21) {
    sVar53 = 0;
  }
  else {
    puVar20 = GetBrotliStorage(s,(ulong)((int)uVar52 * 2 + 0x1f6));
    *puVar20 = s->last_byte_;
    uVar52 = uVar52 & 0xffffffff;
    table = GetHashTable(s,(s->params).quality,uVar52,&table_size);
    puVar40 = (uint8_t *)((long)pHVar50->num_ + (ulong)(uVar3 & uVar31));
    if ((s->params).quality == 0) {
      BrotliCompressFragmentFast
                (m,puVar40,uVar52,is_last,table,table_size,s->cmd_depths_,s->cmd_bits_,
                 &s->cmd_code_numbits_,s->cmd_code_,&storage_ix,puVar20);
    }
    else {
      BrotliCompressFragmentTwoPass
                (m,puVar40,uVar52,is_last,s->command_buf_,s->literal_buf_,table,table_size,
                 &storage_ix,puVar20);
    }
    sVar53 = storage_ix >> 3;
    s->last_byte_ = puVar20[sVar53];
    s->last_byte_bits_ = (byte)storage_ix & 7;
    UpdateLastProcessedPos(s);
    *local_130 = puVar20;
  }
LAB_0013094a:
  *local_138 = sVar53;
  return 1;
code_r0x0012efa6:
  uVar48 = uVar48 + 1;
  lVar47 = lVar47 + -8;
  if (uVar42 >> 3 == uVar48) goto code_r0x0012efb2;
  goto LAB_0012ef99;
code_r0x0012efb2:
  puVar20 = puVar20 + -lVar47;
LAB_0012f06f:
  uVar42 = uVar42 & 7;
  uVar48 = uVar37;
  if (uVar42 != 0) {
    uVar49 = uVar37 | uVar42;
    do {
      uVar48 = uVar37;
      if (*(uint8_t *)((long)local_178 + uVar37 + uVar21) != *puVar20) break;
      puVar20 = puVar20 + 1;
      uVar37 = uVar37 + 1;
      uVar42 = uVar42 - 1;
      uVar48 = uVar49;
    } while (uVar42 != 0);
  }
LAB_0012efd1:
  psVar36 = (size_t *)(uVar48 + uVar21);
  pHVar50 = pHVar43;
  local_190 = (size_t *)uVar52;
  iVar18 = bcmp(local_178,puVar40,(size_t)psVar36);
  if (iVar18 != 0) {
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  pHVar43 = pHVar50;
  pBVar32 = local_188;
  uVar21 = local_128;
  if (0x7f < psVar36) {
    puVar19 = pHVar4->forest_;
    puVar19[local_1a8] = puVar19[((ulong)pBVar35 & local_128) * 2];
    puVar19[local_1a0] = puVar19[((ulong)pBVar35 & local_128) * 2 + 1];
    goto LAB_0012eedf;
  }
  uVar52 = ((ulong)pBVar35 & local_128) * 2;
  puVar19 = pHVar4->forest_;
  if (puVar40[(long)psVar36] < *(byte *)((long)local_178 + (long)psVar36)) {
    puVar19[local_1a8] = uVar29;
    uVar52 = uVar52 | 1;
    uVar23 = (ulong)psVar36;
    psVar36 = local_190;
    local_1a8 = uVar52;
  }
  else {
    puVar19[local_1a0] = uVar29;
    local_1a0 = uVar52;
  }
  pBVar35 = (BrotliEncoderParams *)(ulong)puVar19[uVar52];
  uVar52 = (ulong)psVar36;
  if (local_188 == pBVar35) goto LAB_0012eebd;
  goto LAB_0012ef28;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  const uint32_t bytes = (uint32_t)delta;
  const uint32_t wrapped_last_processed_pos =
      WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;

  if (!EnsureInitialized(s)) return BROTLI_FALSE;
  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_byte_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 502);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = s->last_byte_;
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_byte_ = storage[storage_ix >> 3];
    s->last_byte_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hashers_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);
  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BrotliCreateZopfliBackwardReferences(
        m, bytes, wrapped_last_processed_pos, data, mask,
        &s->params, s->hashers_.h10, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BrotliCreateHqZopfliBackwardReferences(
        m, bytes, wrapped_last_processed_pos, data, mask,
        &s->params, s->hashers_.h10, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(
        bytes, wrapped_last_processed_pos, data, mask,
        &s->params, &s->hashers_, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HashersReset(&s->hashers_, ChooseHasher(&s->params));
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  assert(s->input_pos_ >= s->last_flush_pos_);
  assert(s->input_pos_ > s->last_flush_pos_ || is_last);
  assert(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 502);
    size_t storage_ix = s->last_byte_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = s->last_byte_;
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_byte_ = storage[storage_ix >> 3];
    s->last_byte_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HashersReset(&s->hashers_, ChooseHasher(&s->params));
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}